

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_interpreter_analyzeASTWithExpectedTypeExpressionWithEnvironmentAt
          (sysbvm_context_t *context,sysbvm_tuple_t astNode_,sysbvm_tuple_t expectedTypeExpression_,
          sysbvm_tuple_t environment_,sysbvm_tuple_t sourcePosition_,
          sysbvm_tuple_t *outExpectedCanonicalType)

{
  sysbvm_tuple_t *psVar1;
  _Bool _Var2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t sVar4;
  sysbvm_tuple_t local_a0;
  sysbvm_tuple_t local_98;
  ulong local_90;
  sysbvm_tuple_t sStack_88;
  sysbvm_tuple_t local_80;
  sysbvm_tuple_t local_78;
  sysbvm_tuple_t local_70;
  sysbvm_tuple_t local_68;
  sysbvm_tuple_t *local_60;
  sysbvm_stackFrameRecord_t local_58;
  undefined8 local_48;
  sysbvm_tuple_t *local_40;
  
  if (expectedTypeExpression_ == 0) {
    sVar3 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironmentAt
                      (context,astNode_,0,environment_,sourcePosition_);
    if (outExpectedCanonicalType != (sysbvm_tuple_t *)0x0) {
      if ((sVar3 & 0xf) == 0 && sVar3 != 0) {
        sVar4 = *(sysbvm_tuple_t *)(sVar3 + 0x20);
      }
      else {
        sVar4 = 0;
      }
      *outExpectedCanonicalType = sVar4;
    }
  }
  else {
    _Var2 = sysbvm_astNode_isLiteralNode(context,expectedTypeExpression_);
    if (_Var2) {
      if (outExpectedCanonicalType != (sysbvm_tuple_t *)0x0) {
        sVar3 = sysbvm_astLiteralNode_getValue(expectedTypeExpression_);
        *outExpectedCanonicalType = sVar3;
      }
      sVar3 = sysbvm_astLiteralNode_getValue(expectedTypeExpression_);
      sVar3 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironmentAt
                        (context,astNode_,sVar3,environment_,sourcePosition_);
      return sVar3;
    }
    local_40 = &local_a0;
    local_90 = 0;
    sStack_88 = 0;
    local_80 = 0;
    local_68 = 0;
    local_58.previous = (sysbvm_stackFrameRecord_s *)0x0;
    local_58.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
    local_58._12_4_ = 0;
    local_48 = 8;
    local_a0 = astNode_;
    local_98 = expectedTypeExpression_;
    local_78 = environment_;
    local_70 = sourcePosition_;
    local_60 = outExpectedCanonicalType;
    sysbvm_stackFrame_pushRecord(&local_58);
    local_90 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                         (context,local_98,(context->roots).typeType,environment_);
    if (local_90 == 0) {
      sysbvm_stackFrame_popRecord(&local_58);
      sVar4 = 0;
      sVar3 = local_a0;
    }
    else {
      _Var2 = sysbvm_astNode_isLiteralNode(context,local_90);
      psVar1 = local_60;
      if (!_Var2) {
        if ((local_90 & 0xf) == 0 && local_90 != 0) {
          sStack_88 = *(sysbvm_tuple_t *)(local_90 + 0x20);
        }
        else {
          sStack_88 = 0;
        }
        local_80 = sysbvm_type_getCanonicalPendingInstanceType(context,sStack_88);
        if (local_a0 == 0) {
          sVar3 = sysbvm_type_getDefaultValue(context,local_80);
          local_a0 = sysbvm_astLiteralNode_create(context,sVar3,local_70);
        }
        local_68 = sysbvm_interpreter_analyzeASTWithDirectTypeWithEnvironment
                             (context,local_a0,local_78);
        _Var2 = sysbvm_astNode_isCoerceValueNode(context,local_68);
        if (((!_Var2) || (*(sysbvm_tuple_t *)(local_68 + 0x28) != local_90)) ||
           (*(sysbvm_tuple_t *)(local_68 + 0x20) != local_80)) {
          local_68 = sysbvm_astCoerceValueNode_create(context,local_70,local_90,local_68);
          *(sysbvm_tuple_t *)(local_68 + 0x20) = local_80;
          sVar3 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,local_78)
          ;
          *(sysbvm_tuple_t *)(local_68 + 0x18) = sVar3;
        }
        if (psVar1 != (sysbvm_tuple_t *)0x0) {
          *psVar1 = local_80;
        }
        sysbvm_stackFrame_popRecord(&local_58);
        return local_68;
      }
      sysbvm_stackFrame_popRecord(&local_58);
      sVar3 = local_a0;
      sVar4 = sysbvm_astLiteralNode_getValue(local_90);
    }
    sVar3 = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                      (context,sVar3,sVar4,local_78);
  }
  return sVar3;
}

Assistant:

static sysbvm_tuple_t sysbvm_interpreter_analyzeASTWithExpectedTypeExpressionWithEnvironmentAt(sysbvm_context_t *context, sysbvm_tuple_t astNode_, sysbvm_tuple_t expectedTypeExpression_, sysbvm_tuple_t environment_, sysbvm_tuple_t sourcePosition_, sysbvm_tuple_t *outExpectedCanonicalType)
{
    // Attempt to delegate first.
    if(!expectedTypeExpression_)
    {
        sysbvm_tuple_t result = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironmentAt(context, astNode_, SYSBVM_NULL_TUPLE, environment_, sourcePosition_);
        if(outExpectedCanonicalType)
            *outExpectedCanonicalType = sysbvm_astNode_getAnalyzedType(result);
        return result;
    }
    else if(sysbvm_astNode_isLiteralNode(context, expectedTypeExpression_))
    {
        if(outExpectedCanonicalType)
            *outExpectedCanonicalType = sysbvm_astLiteralNode_getValue(expectedTypeExpression_);
        return sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironmentAt(context, astNode_, sysbvm_astLiteralNode_getValue(expectedTypeExpression_), environment_, sourcePosition_);
    }

    struct {
        sysbvm_tuple_t astNode;
        sysbvm_tuple_t expectedTypeExpression;

        sysbvm_tuple_t analyzedTypeExpression;
        sysbvm_tuple_t analyzedTypeExpressionType;
        sysbvm_tuple_t resultType;

        sysbvm_tuple_t environment;
        sysbvm_tuple_t sourcePosition;

        sysbvm_tuple_t result;
    } gcFrame = {
        .astNode = astNode_,
        .expectedTypeExpression = expectedTypeExpression_,
        .environment = environment_,
        .sourcePosition = sourcePosition_
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    // Make sure the type expression is analyzed.
    gcFrame.analyzedTypeExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.expectedTypeExpression, context->roots.typeType, environment_);
    if(!gcFrame.analyzedTypeExpression)
    {
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.astNode, SYSBVM_NULL_TUPLE, gcFrame.environment);
    }
    else if(sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedTypeExpression))
    {
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.astNode, sysbvm_astLiteralNode_getValue(gcFrame.analyzedTypeExpression), gcFrame.environment);
    }

    gcFrame.analyzedTypeExpressionType = sysbvm_astNode_getAnalyzedType(gcFrame.analyzedTypeExpression);
    gcFrame.resultType = sysbvm_type_getCanonicalPendingInstanceType(context, gcFrame.analyzedTypeExpressionType);
    if(!gcFrame.astNode)
        gcFrame.astNode = sysbvm_astLiteralNode_create(context, sysbvm_type_getDefaultValue(context, gcFrame.resultType), gcFrame.sourcePosition);

    // Analyze the value expression.
    gcFrame.result = sysbvm_interpreter_analyzeASTWithDirectTypeWithEnvironment(context, gcFrame.astNode, gcFrame.environment);
    bool shouldAddCoercionNode = true;

    if(sysbvm_astNode_isCoerceValueNode(context, gcFrame.result))
    {
        sysbvm_astCoerceValueNode_t **coerceNode = (sysbvm_astCoerceValueNode_t **)&gcFrame.result;
        if((*coerceNode)->typeExpression == gcFrame.analyzedTypeExpression
        && (*coerceNode)->super.analyzedType == gcFrame.resultType)
            shouldAddCoercionNode = false;
    }

    // Add the coercion node
    if(shouldAddCoercionNode)
    {
        gcFrame.result = sysbvm_astCoerceValueNode_create(context, gcFrame.sourcePosition, gcFrame.analyzedTypeExpression, gcFrame.result);

        sysbvm_astCoerceValueNode_t **coerceNode = (sysbvm_astCoerceValueNode_t **)&gcFrame.result;
        (*coerceNode)->super.analyzedType = gcFrame.resultType;
        (*coerceNode)->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, gcFrame.environment);

    }

    if(outExpectedCanonicalType)
        *outExpectedCanonicalType = gcFrame.resultType;

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}